

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readme_examples.c
# Opt level: O3

void create_monitor_should_create_a_monitor(void)

{
  cJSON *pcVar1;
  cJSON *object;
  cJSON *pcVar2;
  cJSON *object_00;
  cJSON *pcVar3;
  uchar *expected;
  internal_hooks *hooks;
  cJSON_bool in_R8D;
  long lVar4;
  uint uVar5;
  
  object = (cJSON *)(*global_hooks.allocate)(0x40);
  if (object != (cJSON *)0x0) {
    object->child = (cJSON *)0x0;
    *(undefined8 *)&object->type = 0;
    object->valuedouble = 0.0;
    object->string = (char *)0x0;
    object->valuestring = (char *)0x0;
    *(undefined8 *)&object->valueint = 0;
    object->next = (cJSON *)0x0;
    object->prev = (cJSON *)0x0;
    object->type = 0x40;
    pcVar2 = cJSON_CreateString("Awesome 4K");
    if (pcVar2 != (cJSON *)0x0) {
      expected = (uchar *)0x0;
      add_item_to_object(object,"name",pcVar2,(internal_hooks *)0x0,in_R8D);
      pcVar2 = (cJSON *)(*global_hooks.allocate)(0x40);
      if (pcVar2 == (cJSON *)0x0) goto LAB_00105cab;
      pcVar2->child = (cJSON *)0x0;
      *(undefined8 *)&pcVar2->type = 0;
      pcVar2->valuedouble = 0.0;
      pcVar2->string = (char *)0x0;
      pcVar2->valuestring = (char *)0x0;
      *(undefined8 *)&pcVar2->valueint = 0;
      pcVar2->next = (cJSON *)0x0;
      pcVar2->prev = (cJSON *)0x0;
      pcVar2->type = 0x20;
      add_item_to_object(object,"resolutions",pcVar2,(internal_hooks *)0x0,in_R8D);
      lVar4 = 0;
      do {
        object_00 = (cJSON *)(*global_hooks.allocate)(0x40);
        if (object_00 == (cJSON *)0x0) {
LAB_00105ca3:
          expected = (uchar *)0x0;
          goto LAB_00105cab;
        }
        object_00->child = (cJSON *)0x0;
        *(undefined8 *)&object_00->type = 0;
        object_00->valuedouble = 0.0;
        object_00->string = (char *)0x0;
        object_00->valuestring = (char *)0x0;
        *(undefined8 *)&object_00->valueint = 0;
        object_00->next = (cJSON *)0x0;
        object_00->prev = (cJSON *)0x0;
        object_00->type = 0x40;
        if (pcVar2 != object_00) {
          pcVar3 = pcVar2->child;
          if (pcVar3 == (cJSON *)0x0) {
            pcVar2->child = object_00;
            pcVar3 = object_00;
          }
          else {
            pcVar1 = pcVar3->prev;
            if (pcVar1 == (cJSON *)0x0) goto LAB_00105ba0;
            pcVar1->next = object_00;
            object_00->prev = pcVar1;
          }
          pcVar3->prev = object_00;
        }
LAB_00105ba0:
        uVar5 = (&DAT_001090c0)[lVar4 * 2];
        pcVar3 = (cJSON *)(*global_hooks.allocate)(0x40);
        if (pcVar3 == (cJSON *)0x0) goto LAB_00105ca3;
        pcVar3->child = (cJSON *)0x0;
        *(undefined8 *)&pcVar3->type = 0;
        pcVar3->valuedouble = 0.0;
        pcVar3->string = (char *)0x0;
        pcVar3->valuestring = (char *)0x0;
        *(undefined8 *)&pcVar3->valueint = 0;
        pcVar3->next = (cJSON *)0x0;
        pcVar3->prev = (cJSON *)0x0;
        pcVar3->type = 8;
        pcVar3->valuedouble = (double)uVar5;
        if (0x7ffffffe < uVar5) {
          uVar5 = 0x7fffffff;
        }
        pcVar3->valueint = uVar5;
        add_item_to_object(object_00,"width",pcVar3,(internal_hooks *)0x0,in_R8D);
        uVar5 = (&DAT_001090c4)[lVar4 * 2];
        pcVar3 = (cJSON *)(*global_hooks.allocate)(0x40);
        if (pcVar3 == (cJSON *)0x0) goto LAB_00105ca3;
        pcVar3->child = (cJSON *)0x0;
        *(undefined8 *)&pcVar3->type = 0;
        pcVar3->valuedouble = 0.0;
        pcVar3->string = (char *)0x0;
        pcVar3->valuestring = (char *)0x0;
        *(undefined8 *)&pcVar3->valueint = 0;
        pcVar3->next = (cJSON *)0x0;
        pcVar3->prev = (cJSON *)0x0;
        pcVar3->type = 8;
        pcVar3->valuedouble = (double)uVar5;
        if (0x7ffffffe < uVar5) {
          uVar5 = 0x7fffffff;
        }
        pcVar3->valueint = uVar5;
        add_item_to_object(object_00,"height",pcVar3,(internal_hooks *)0x0,in_R8D);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      expected = print(object,1,hooks);
      if (expected != (uchar *)0x0) goto LAB_00105cab;
      create_monitor_should_create_a_monitor_cold_1();
    }
  }
  expected = (uchar *)0x0;
LAB_00105cab:
  cJSON_Delete(object);
  UnityAssertEqualString
            ((char *)expected,
             "{\n\t\"name\":\t\"Awesome 4K\",\n\t\"resolutions\":\t[{\n\t\t\t\"width\":\t1280,\n\t\t\t\"height\":\t720\n\t\t}, {\n\t\t\t\"width\":\t1920,\n\t\t\t\"height\":\t1080\n\t\t}, {\n\t\t\t\"width\":\t3840,\n\t\t\t\"height\":\t2160\n\t\t}]\n}"
             ,(char *)0x0,0xdd);
  free(expected);
  return;
}

Assistant:

static void create_monitor_should_create_a_monitor(void)
{
    char *monitor = create_monitor();

    TEST_ASSERT_EQUAL_STRING(monitor, json);

    free(monitor);
}